

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzysmp.cpp
# Opt level: O3

void __thiscall
TPZFYsmpMatrix<std::complex<double>_>::AddKel
          (TPZFYsmpMatrix<std::complex<double>_> *this,TPZFMatrix<std::complex<double>_> *elmat,
          TPZVec<long> *destinationindex)

{
  double *pdVar1;
  long lVar2;
  long *plVar3;
  complex<double> *pcVar4;
  long lVar5;
  complex<double> *pcVar6;
  double dVar7;
  long lVar8;
  ostream *poVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  double in_XMM1_Qa;
  double dVar14;
  long local_60;
  
  lVar11 = (elmat->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow;
  if (0 < lVar11) {
    local_60 = 0;
    lVar10 = 0;
    do {
      if (0 < lVar11) {
        lVar13 = 0;
        dVar14 = in_XMM1_Qa;
        do {
          lVar11 = destinationindex->fStore[local_60];
          lVar2 = destinationindex->fStore[lVar13];
          (*(elmat->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0x24])(elmat,local_60,lVar13);
          dVar7 = cabs((double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
          in_XMM1_Qa = 1e-12;
          if (1e-12 <= ABS(dVar7)) {
            lVar12 = lVar10 + 1;
            plVar3 = (this->fIA).fStore;
            lVar8 = plVar3[lVar11];
            lVar11 = plVar3[lVar11 + 1];
            if (((lVar12 < lVar8) || (lVar11 <= lVar12)) ||
               ((this->fJA).fStore[lVar10 + 1] != lVar2)) {
              lVar10 = lVar8;
              if (lVar8 < lVar11) {
                plVar3 = (this->fJA).fStore;
                lVar12 = lVar8 * 8;
                do {
                  lVar5 = *(long *)((long)plVar3 + lVar12);
                  lVar10 = lVar8;
                  if (lVar5 == lVar2) {
                    if (lVar2 == -1) {
LAB_00d6b0f1:
                      *(long *)((long)plVar3 + lVar12) = lVar2;
                      pcVar6 = (this->fA).fStore;
                      *(ulong *)(pcVar6->_M_value + lVar12 * 2) =
                           CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
                      *(double *)(pcVar6->_M_value + lVar12 * 2 + 8) = dVar14;
                    }
                    else {
                      pcVar6 = (this->fA).fStore;
                      pdVar1 = (double *)(pcVar6->_M_value + lVar12 * 2);
                      dVar7 = pdVar1[1];
                      in_XMM1_Qa = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da) + *pdVar1;
                      pdVar1 = (double *)(pcVar6->_M_value + lVar12 * 2);
                      *pdVar1 = in_XMM1_Qa;
                      pdVar1[1] = dVar14 + dVar7;
                    }
                    goto LAB_00d6b113;
                  }
                  if (lVar5 == -1) goto LAB_00d6b0f1;
                  lVar8 = lVar8 + 1;
                  lVar12 = lVar12 + 8;
                  lVar10 = lVar11;
                } while (lVar11 != lVar8);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,
                         "TPZFYsmpMatrix::AddKel: Non existing position on sparse matrix: line =",
                         0x46);
              poVar9 = std::ostream::_M_insert<long>((long)&std::cout);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9," column =",9);
              poVar9 = std::ostream::_M_insert<long>((long)poVar9);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
              std::ostream::put((char)poVar9);
              std::ostream::flush();
            }
            else {
              pcVar4 = (this->fA).fStore;
              pcVar6 = pcVar4 + lVar12;
              dVar7 = *(double *)(pcVar6->_M_value + 8);
              in_XMM1_Qa = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da) +
                           *(double *)pcVar6->_M_value;
              pcVar4 = pcVar4 + lVar12;
              *(double *)pcVar4->_M_value = in_XMM1_Qa;
              *(double *)(pcVar4->_M_value + 8) = dVar14 + dVar7;
              lVar10 = lVar12;
            }
          }
LAB_00d6b113:
          lVar13 = lVar13 + 1;
          lVar11 = (elmat->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow;
          dVar14 = in_XMM1_Qa;
        } while (lVar13 < lVar11);
      }
      local_60 = local_60 + 1;
    } while (local_60 < lVar11);
  }
  return;
}

Assistant:

void TPZFYsmpMatrix<TVar>::AddKel(TPZFMatrix<TVar> & elmat, TPZVec<int64_t> & destinationindex){
    int64_t i,j,k = 0;
    TVar value=0.;
    int64_t ipos,jpos;
    for(i=0;i<elmat.Rows();i++){
        for(j=0;j<elmat.Rows();j++){
            ipos=destinationindex[i];
            jpos=destinationindex[j];
            value=elmat.GetVal(i,j);
            //cout << "j= " << j << endl;
            if(!IsZero(value)){
                //cout << "fIA[ipos] " << fIA[ipos] << "     fIA[ipos+1] " << fIA[ipos+1] << endl;
                int flag = 0;
				k++;
				if(k >= fIA[ipos] && k < fIA[ipos+1] && fJA[k]==jpos)
				{ // OK -> elements in sequence
					fA[k]+=value;
					flag = 1;
				}else
				{
					for(k=fIA[ipos];k<fIA[ipos+1];k++){
						if(fJA[k]==jpos || fJA[k]==-1){
							//cout << "fJA[k] " << fJA[k] << " jpos "<< jpos << "   " << value << endl;
							//cout << "k " << k << "   "<< jpos << "   " << value << endl;
							flag=1;
							if(fJA[k]==-1){
								fJA[k]=jpos;
								fA[k]=value;
								// cout << jpos << "   " << value << endl;
								break;
							}else{
								fA[k]+=value;
								break;
							}
						}
					}
				}
                if(!flag) cout << "TPZFYsmpMatrix::AddKel: Non existing position on sparse matrix: line =" << ipos << " column =" << jpos << endl;         }
        }
    }
}